

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayDisposer::dispose<capnp::Orphan<capnp::compiler::Expression>>
          (ArrayDisposer *this,Orphan<capnp::compiler::Expression> *firstElement,size_t elementCount
          ,size_t capacity)

{
  size_t capacity_local;
  size_t elementCount_local;
  Orphan<capnp::compiler::Expression> *firstElement_local;
  ArrayDisposer *this_local;
  
  (**this->_vptr_ArrayDisposer)
            (this,firstElement,0x20,elementCount,capacity,
             Dispose_<capnp::Orphan<capnp::compiler::Expression>_>::destruct);
  return;
}

Assistant:

void ArrayDisposer::dispose(T* firstElement, size_t elementCount, size_t capacity) const {
  if constexpr (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    disposeImpl(const_cast<RemoveConst<T>*>(firstElement),
                         sizeof(T), elementCount, capacity, nullptr);
  } else {
    disposeImpl(const_cast<RemoveConst<T>*>(firstElement),
                         sizeof(T), elementCount, capacity, &Dispose_<T>::destruct);
  }
}